

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::WildcardPattern::WildcardPattern
          (WildcardPattern *this,string *pattern,CaseSensitive caseSensitivity)

{
  string *__return_storage_ptr__;
  char *pcVar1;
  size_type sVar2;
  string asStack_38 [32];
  
  this->m_caseSensitivity = caseSensitivity;
  this->m_wildcard = NoWildcard;
  __return_storage_ptr__ = &this->m_pattern;
  normaliseString(__return_storage_ptr__,this,pattern);
  sVar2 = (this->m_pattern)._M_string_length;
  if (sVar2 != 0) {
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if (*pcVar1 == '*') {
      std::__cxx11::string::substr((ulong)asStack_38,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,asStack_38);
      std::__cxx11::string::~string(asStack_38);
      this->m_wildcard = WildcardAtStart;
      sVar2 = (this->m_pattern)._M_string_length;
      if (sVar2 == 0) {
        return;
      }
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    }
    if (pcVar1[sVar2 - 1] == '*') {
      std::__cxx11::string::substr((ulong)asStack_38,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,asStack_38);
      std::__cxx11::string::~string(asStack_38);
      *(undefined1 *)&this->m_wildcard = (char)this->m_wildcard | WildcardAtEnd;
    }
  }
  return;
}

Assistant:

WildcardPattern::WildcardPattern( std::string const& pattern,
                                      CaseSensitive caseSensitivity )
    :   m_caseSensitivity( caseSensitivity ),
        m_pattern( normaliseString( pattern ) )
    {
        if( startsWith( m_pattern, '*' ) ) {
            m_pattern = m_pattern.substr( 1 );
            m_wildcard = WildcardAtStart;
        }
        if( endsWith( m_pattern, '*' ) ) {
            m_pattern = m_pattern.substr( 0, m_pattern.size()-1 );
            m_wildcard = static_cast<WildcardPosition>( m_wildcard | WildcardAtEnd );
        }
    }